

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O3

CVmTimeZone * __thiscall
CVmTimeZoneCache::parse_zone_posixTZ(CVmTimeZoneCache *this,char *name,size_t len)

{
  int iVar1;
  ZoneHashEntry *entry;
  CVmTimeZone *pCVar2;
  long lVar3;
  os_tzinfo_t *poVar4;
  ZoneHashEntry *pZVar5;
  byte bVar6;
  os_tzinfo_t desc;
  os_tzinfo_t local_7c;
  
  bVar6 = 0;
  pCVar2 = (CVmTimeZone *)0x0;
  iVar1 = oss_parse_posix_tz(&local_7c,name,len,0);
  if (iVar1 != 0) {
    entry = (ZoneHashEntry *)CVmHashTable::find(this->synth_tab_,name,len);
    if (entry == (ZoneHashEntry *)0x0) {
      entry = (ZoneHashEntry *)operator_new(0xa0);
      CVmHashEntry::CVmHashEntry((CVmHashEntry *)entry,name,len,1);
      entry->tz = (CVmTimeZone *)0x0;
      *(undefined4 *)&(entry->super_CVmHashEntryCI).super_CVmHashEntry.field_0x24 = 3;
      entry->link_from = (ZoneHashEntryLink *)0x0;
      entry->nxt = (ZoneHashEntry *)0x0;
      (entry->super_CVmHashEntryCI).super_CVmHashEntry._vptr_CVmHashEntry =
           (_func_int **)&PTR__ZoneHashEntry_00364ba0;
      poVar4 = &local_7c;
      pZVar5 = entry + 1;
      for (lVar3 = 0x17; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(int32_t *)&(pZVar5->super_CVmHashEntryCI).super_CVmHashEntry._vptr_CVmHashEntry =
             poVar4->std_ofs;
        poVar4 = (os_tzinfo_t *)((long)poVar4 + ((ulong)bVar6 * -2 + 1) * 4);
        pZVar5 = (ZoneHashEntry *)((long)pZVar5 + (ulong)bVar6 * -8 + 4);
      }
      CVmHashTable::add(this->synth_tab_,(CVmHashEntry *)entry);
    }
    pCVar2 = tz_from_hash(this,entry);
  }
  return pCVar2;
}

Assistant:

CVmTimeZone *CVmTimeZoneCache::parse_zone_posixTZ(
    VMG_ const char *name, size_t len)
{
    /* 
     *   Run it through the POSIX TZ parser.  Note that the zoneinfo format
     *   uses negative offsets going west (e.g., EST-5), in contrast to the
     *   original TZ format. 
     */
    os_tzinfo_t desc;
    if (oss_parse_posix_tz(&desc, name, len, FALSE))
    {
        /* got it - check to see if it's already defined */
        ZoneHashEntry *entry = (ZoneHashEntry *)synth_tab_->find(name, len);
        if (entry == 0)
        {
            /* it's not there yet - create a new entry for it */
            entry = new ZoneHashEntrySynth(name, len, TRUE, &desc);
            synth_tab_->add(entry);
        }

        /* find or create its timezone object */
        return tz_from_hash(vmg_ entry);
    }

    /* it's not ours */
    return 0;
}